

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

StringPtr * __thiscall
kj::Table<unsigned_int,_kj::InsertionOrderIndex>::insert
          (Table<unsigned_int,_kj::InsertionOrderIndex> *this,StringPtr *row)

{
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 row_00;
  size_t pos;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar1;
  StringPtr *pSVar2;
  StringPtr SVar3;
  Maybe<unsigned_long> local_38;
  undefined1 local_28 [8];
  NullableValue<unsigned_long> existing;
  StringPtr *row_local;
  Table<unsigned_int,_kj::InsertionOrderIndex> *this_local;
  
  existing.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)row;
  pos = Vector<unsigned_int>::size((Vector<unsigned_int> *)this);
  row_00 = existing.field_1;
  SVar3 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&local_38,this,pos,(StringPtr *)row_00,(uint)SVar3.content.ptr);
  other = _::readMaybe<unsigned_long>(&local_38);
  _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_28,other);
  Maybe<unsigned_long>::~Maybe(&local_38);
  puVar1 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_28);
  if (puVar1 != (unsigned_long *)0x0) {
    _::throwDuplicateTableRow();
  }
  pSVar2 = mv<unsigned_int>((StringPtr *)existing.field_1);
  pSVar2 = Vector<unsigned_int>::add<unsigned_int>((Vector<unsigned_int> *)this,pSVar2);
  _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_28);
  return pSVar2;
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }